

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O3

void __thiscall ON_ErrorLog::Dump(ON_ErrorLog *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  ON_ErrorEvent *this_00;
  ulong uVar3;
  ON_TextLogIndent indent1;
  ON_TextLogIndent local_30;
  
  uVar1 = this->m_event_count;
  uVar2 = 0x20;
  if (uVar1 < 0x20) {
    uVar2 = uVar1;
  }
  ON_TextLog::Print(text_log,"Error log: %u events\n",(ulong)uVar2);
  ON_TextLogIndent::ON_TextLogIndent(&local_30,text_log);
  if (uVar1 != 0) {
    this_00 = this->m_events;
    uVar3 = (ulong)uVar2;
    do {
      ON_ErrorEvent::Dump(this_00,text_log);
      this_00 = this_00 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  ON_TextLogIndent::~ON_TextLogIndent(&local_30);
  return;
}

Assistant:

void ON_ErrorLog::Dump(
  class ON_TextLog& text_log
) const
{
  const unsigned int count = Count();
  text_log.Print("Error log: %u events\n", count);
  ON_TextLogIndent indent1(text_log);
  for (unsigned int i = 0; i < count; i++)
  {
    m_events[i].Dump(text_log);
  }
}